

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

int FsPutFileW(WCHAR *LocalName,WCHAR *RemoteName,int CopyFlags)

{
  allocator<unsigned_short> *this;
  byte bVar1;
  unsigned_short *puVar2;
  char *__filename;
  rest_client_exception *e;
  runtime_error *e_1;
  string local_2f0;
  int local_2d0;
  int local_2cc;
  int err;
  char16_t local_2a4 [2];
  unsigned_short *local_2a0;
  __normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  local_298;
  allocator<unsigned_short> local_289;
  undefined1 local_288 [8];
  wcharstring wLocalName;
  undefined1 local_260 [8];
  wcharstring wRemoteName;
  long local_230;
  ifstream ifs;
  int CopyFlags_local;
  WCHAR *RemoteName_local;
  WCHAR *LocalName_local;
  
  if ((CopyFlags & 2U) == 0) {
    std::ifstream::ifstream(&local_230);
    this = (allocator<unsigned_short> *)((long)&wLocalName.field_2 + 0xf);
    std::allocator<unsigned_short>::allocator(this);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)local_260,RemoteName,this);
    std::allocator<unsigned_short>::~allocator
              ((allocator<unsigned_short> *)((long)&wLocalName.field_2 + 0xf));
    std::allocator<unsigned_short>::allocator(&local_289);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)local_288,LocalName,&local_289);
    std::allocator<unsigned_short>::~allocator(&local_289);
    local_298._M_current =
         (unsigned_short *)
         std::__cxx11::
         basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
         ::begin((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)local_260);
    local_2a0 = (unsigned_short *)
                std::__cxx11::
                basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                ::end((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)local_260);
    local_2a4[1] = 0x5c;
    local_2a4[0] = L'/';
    std::
    replace<__gnu_cxx::__normal_iterator<unsigned_short*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>,char16_t>
              (local_298,
               (__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                )local_2a0,local_2a4 + 1,local_2a4);
    puVar2 = std::__cxx11::
             basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
             ::data((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)local_288);
    toUTF8_abi_cxx11_((string *)&err,puVar2);
    std::operator|(_S_bin,_S_in);
    std::ifstream::open((string *)&local_230,(_Ios_Openmode)&err);
    std::__cxx11::string::~string((string *)&err);
    bVar1 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
    if (((bVar1 & 1) == 0) && (bVar1 = std::ios::bad(), (bVar1 & 1) == 0)) {
      local_2d0 = (*gProgressProcW)(gPluginNumber,LocalName,RemoteName,0);
      if (local_2d0 == 0) {
        puVar2 = std::__cxx11::
                 basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                 ::data((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                         *)local_260);
        toUTF8_abi_cxx11_(&local_2f0,puVar2);
        YdiskRestClient::uploadFile(&rest_client,&local_2f0,(ifstream *)&local_230,CopyFlags & 1);
        std::__cxx11::string::~string((string *)&local_2f0);
        (*gProgressProcW)(gPluginNumber,LocalName,RemoteName,100);
        std::ifstream::close();
        if ((CopyFlags & 4U) != 0) {
          toUTF8_abi_cxx11_((string *)&e_1,LocalName);
          __filename = (char *)std::__cxx11::string::c_str();
          remove(__filename);
          std::__cxx11::string::~string((string *)&e_1);
        }
        local_2cc = 0;
      }
      else {
        LocalName_local._4_4_ = 5;
        local_2cc = 1;
      }
    }
    else {
      LocalName_local._4_4_ = 3;
      local_2cc = 1;
    }
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)local_288);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)local_260);
    std::ifstream::~ifstream(&local_230);
    if (local_2cc == 0) {
      LocalName_local._4_4_ = 0;
    }
  }
  else {
    LocalName_local._4_4_ = 6;
  }
  return LocalName_local._4_4_;
}

Assistant:

int DCPCALL FsPutFileW(WCHAR* LocalName,WCHAR* RemoteName,int CopyFlags) {
    if (CopyFlags & FS_COPYFLAGS_RESUME)
        return FS_FILE_NOTSUPPORTED;

    try {
        std::ifstream ifs;
        wcharstring wRemoteName(RemoteName), wLocalName(LocalName);
        std::replace(wRemoteName.begin(), wRemoteName.end(), u'\\', u'/');
        ifs.open(toUTF8(wLocalName.data()), std::ios::binary | std::ofstream::in);
        if (!ifs || ifs.bad())
            return FS_FILE_READERROR;

        int err = gProgressProcW(gPluginNumber, LocalName, RemoteName, 0);
        if (err)
            return FS_FILE_USERABORT;
        rest_client.uploadFile(toUTF8(wRemoteName.data()), ifs, (CopyFlags & FS_COPYFLAGS_OVERWRITE));
        gProgressProcW(gPluginNumber, LocalName, RemoteName, 100);

        ifs.close();

        if(CopyFlags & FS_COPYFLAGS_MOVE)
            std::remove(toUTF8(LocalName).c_str());

    } catch(rest_client_exception & e){
        if(e.get_status() == 409){
            return FS_FILE_EXISTS;
        } else {
            gRequestProcW(gPluginNumber, RT_MsgOK, (WCHAR*)u"Error", (WCHAR*) fromUTF8(e.what()).c_str(), NULL, 0);
            return FS_FILE_WRITEERROR;
        }
    } catch (std::runtime_error & e){
        gRequestProcW(gPluginNumber, RT_MsgOK, (WCHAR*)u"Error", (WCHAR*) fromUTF8(e.what()).c_str(), NULL, 0);
        return FS_FILE_WRITEERROR;
    }

    return FS_FILE_OK;
}